

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O0

bool __thiscall
axl::zip::ZipReader::extractFileToFile(ZipReader *this,size_t index,StringRef *fileName)

{
  mz_bool mVar1;
  mz_bool result;
  mz_uint in_stack_000001d4;
  char *in_stack_000001d8;
  mz_uint in_stack_000001e4;
  mz_zip_archive *in_stack_000001e8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_61;
  uint in_stack_ffffffffffffffbc;
  ErrorRef *in_stack_ffffffffffffffc0;
  
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(in_stack_ffffffffffffff90);
  mVar1 = mz_zip_reader_extract_to_file
                    (in_stack_000001e8,in_stack_000001e4,in_stack_000001d8,in_stack_000001d4);
  in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
  if (mVar1 == 0) {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffbc = 0x1000000;
    local_61 = err::fail((ErrorRef *)0x169df3);
  }
  else {
    local_61 = true;
  }
  if ((in_stack_ffffffffffffffbc & 0x1000000) != 0) {
    err::ErrorRef::~ErrorRef((ErrorRef *)0x169e20);
  }
  return local_61;
}

Assistant:

bool
ZipReader::extractFileToFile(
	size_t index,
	const sl::StringRef& fileName
) const {
	ASSERT(isOpen());

	mz_bool result = mz_zip_reader_extract_to_file(
		m_zip,
		index,
		fileName.sz(),
		0
	);

	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}